

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

bool getOriginalDst(Socket *s,uint32 *addr,uint16 *port)

{
  bool bVar1;
  sockaddr_in destAddr;
  usize destAddrLen;
  undefined1 auStack_28 [2];
  ushort local_26;
  uint local_24;
  usize local_18;
  
  local_18 = 0x10;
  bVar1 = Socket::getSockOpt(s,0,0x50,auStack_28,&local_18);
  if (bVar1) {
    *addr = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
            local_24 << 0x18;
    *port = local_26 << 8 | local_26 >> 8;
  }
  return bVar1;
}

Assistant:

bool getOriginalDst(Socket& s, uint32& addr, uint16& port)
{
#ifdef _WIN32
    return s.getSockName(addr, port);
#else
    sockaddr_in destAddr;
    usize destAddrLen = sizeof(destAddr);
    if(!s.getSockOpt(SOL_IP, SO_ORIGINAL_DST, &destAddr, destAddrLen))
        return false;
    addr = ntohl(destAddr.sin_addr.s_addr);
    port = ntohs(destAddr.sin_port);
    return true;
#endif
}